

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::isCompInert(Normalizer2Impl *this,UChar32 c,UBool onlyContiguous)

{
  UBool UVar1;
  uint16_t norm16_00;
  uint16_t *puVar2;
  undefined1 local_29;
  undefined1 local_19;
  uint16_t norm16;
  UBool onlyContiguous_local;
  UChar32 c_local;
  Normalizer2Impl *this_local;
  
  norm16_00 = getNorm16(this,c);
  UVar1 = isCompYesAndZeroCC(this,norm16_00);
  local_19 = false;
  if ((UVar1 != '\0') && (local_19 = false, (norm16_00 & 1) != 0)) {
    local_29 = true;
    if (onlyContiguous != '\0') {
      UVar1 = isInert(norm16_00);
      local_29 = true;
      if (UVar1 == '\0') {
        puVar2 = getMapping(this,norm16_00);
        local_29 = *puVar2 < 0x200;
      }
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

UBool isCompInert(UChar32 c, UBool onlyContiguous) const {
        uint16_t norm16=getNorm16(c);
        return isCompYesAndZeroCC(norm16) &&
            (norm16 & HAS_COMP_BOUNDARY_AFTER) != 0 &&
            (!onlyContiguous || isInert(norm16) || *getMapping(norm16) <= 0x1ff);
    }